

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_with_face(REF_CELL ref_cell,REF_INT *face_nodes,REF_INT *cell0,REF_INT *cell1)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  REF_INT ncandidate;
  REF_INT ntarget;
  REF_INT orig [27];
  REF_INT candidate [27];
  REF_INT target [27];
  REF_INT local_1a8;
  uint local_1a0;
  uint local_19c;
  int *local_198;
  int *local_190;
  REF_INT local_188 [28];
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  uVar10 = 0xffffffff;
  *cell0 = -1;
  *cell1 = -1;
  uVar5 = ref_sort_unique_int(4,face_nodes,(REF_INT *)&local_19c,local_a8);
  if (uVar5 == 0) {
    iVar1 = *face_nodes;
    if ((-1 < (long)iVar1) && (iVar1 < ref_cell->ref_adj->nnode)) {
      uVar10 = (ulong)(uint)ref_cell->ref_adj->first[iVar1];
    }
    if ((int)uVar10 == -1) {
      uVar5 = 0;
    }
    else {
      local_1a8 = ref_cell->ref_adj->item[(int)uVar10].ref;
      local_198 = cell1;
      local_190 = cell0;
      do {
        if (0 < ref_cell->face_per) {
          lVar11 = 0;
          lVar9 = 0;
          do {
            pRVar2 = ref_cell->c2n;
            iVar1 = ref_cell->size_per;
            pRVar3 = ref_cell->f2n;
            lVar8 = 0;
            do {
              local_188[lVar8] =
                   pRVar2[(long)*(int *)((long)pRVar3 + lVar8 * 4 + lVar11) +
                          (long)iVar1 * (long)local_1a8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            uVar5 = ref_sort_unique_int(4,local_188,(REF_INT *)&local_1a0,local_118);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                     ,0x463,"ref_cell_with_face",(ulong)uVar5,"c uniq");
              return uVar5;
            }
            if (local_19c == local_1a0) {
              if ((int)local_19c < 1) {
                uVar5 = 0;
              }
              else {
                uVar7 = 0;
                uVar5 = 0;
                do {
                  uVar5 = uVar5 + (local_a8[uVar7] == local_118[uVar7]);
                  uVar7 = uVar7 + 1;
                } while (local_19c != uVar7);
              }
              if (local_19c == uVar5) {
                piVar6 = local_190;
                if ((*local_190 != -1) && (piVar6 = local_198, *local_198 != -1)) {
                  return 3;
                }
                *piVar6 = local_1a8;
              }
            }
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + 0x10;
          } while (lVar9 < ref_cell->face_per);
        }
        pRVar4 = ref_cell->ref_adj->item;
        iVar1 = pRVar4[(int)uVar10].next;
        uVar10 = (ulong)iVar1;
        if (uVar10 == 0xffffffffffffffff) {
          local_1a8 = -1;
        }
        else {
          local_1a8 = pRVar4[uVar10].ref;
        }
        uVar5 = 0;
      } while (iVar1 != -1);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x45c,
           "ref_cell_with_face",(ulong)uVar5,"t uniq");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cell_with_face(REF_CELL ref_cell, REF_INT *face_nodes,
                                      REF_INT *cell0, REF_INT *cell1) {
  REF_INT item, node, same, cell_face, cell;
  REF_INT ntarget, target[REF_CELL_MAX_SIZE_PER];
  REF_INT ncandidate, candidate[REF_CELL_MAX_SIZE_PER];
  REF_INT orig[REF_CELL_MAX_SIZE_PER];

  (*cell0) = REF_EMPTY;
  (*cell1) = REF_EMPTY;

  RSS(ref_sort_unique_int(4, face_nodes, &ntarget, target), "t uniq");

  each_ref_cell_having_node(ref_cell, face_nodes[0], item, cell) {
    each_ref_cell_cell_face(ref_cell, cell_face) {
      for (node = 0; node < 4; node++) {
        orig[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
      }
      RSS(ref_sort_unique_int(4, orig, &ncandidate, candidate), "c uniq");

      if (ntarget == ncandidate) {
        same = 0;
        for (node = 0; node < ntarget; node++) {
          if (target[node] == candidate[node]) same++;
        }

        if (ntarget == same) {
          if (REF_EMPTY == *cell0) {
            (*cell0) = cell;
          } else {
            if (REF_EMPTY != *cell1)
              return REF_INVALID; /* more than 2 cells with face */
            (*cell1) = cell;
          }
        }
      }
    }
  }

  return REF_SUCCESS;
}